

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.c
# Opt level: O3

int rsa_encrypt_wrap(void *ctx,uchar *input,size_t ilen,uchar *output,size_t *olen,size_t osize,
                    _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = mbedtls_rsa_get_len((mbedtls_rsa_context *)ctx);
  *olen = sVar2;
  if (osize < sVar2) {
    iVar1 = -0x4400;
  }
  else {
    iVar1 = mbedtls_rsa_pkcs1_encrypt((mbedtls_rsa_context *)ctx,f_rng,p_rng,0,ilen,input,output);
  }
  return iVar1;
}

Assistant:

static int rsa_encrypt_wrap( void *ctx,
                    const unsigned char *input, size_t ilen,
                    unsigned char *output, size_t *olen, size_t osize,
                    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    mbedtls_rsa_context * rsa = (mbedtls_rsa_context *) ctx;
    *olen = mbedtls_rsa_get_len( rsa );

    if( *olen > osize )
        return( MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE );

    return( mbedtls_rsa_pkcs1_encrypt( rsa, f_rng, p_rng, MBEDTLS_RSA_PUBLIC,
                                       ilen, input, output ) );
}